

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall glslang::TReflection::dump(TReflection *this)

{
  pointer pTVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  puts("Uniform reflection:");
  lVar3 = 0;
  for (uVar2 = 0;
      pTVar1 = (this->indexToUniform).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->indexToUniform).
                             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50);
      uVar2 = uVar2 + 1) {
    TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + 0x50;
  }
  putchar(10);
  puts("Uniform block reflection:");
  lVar3 = 0;
  for (uVar2 = 0;
      pTVar1 = (this->indexToUniformBlock).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->indexToUniformBlock).
                             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50);
      uVar2 = uVar2 + 1) {
    TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + 0x50;
  }
  putchar(10);
  puts("Buffer variable reflection:");
  lVar3 = 0;
  for (uVar2 = 0;
      pTVar1 = (this->indexToBufferVariable).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->indexToBufferVariable).
                             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50);
      uVar2 = uVar2 + 1) {
    TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + 0x50;
  }
  putchar(10);
  puts("Buffer block reflection:");
  lVar3 = 0;
  for (uVar2 = 0;
      pTVar1 = (this->indexToBufferBlock).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->indexToBufferBlock).
                             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50);
      uVar2 = uVar2 + 1) {
    TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + 0x50;
  }
  putchar(10);
  puts("Pipeline input reflection:");
  lVar3 = 0;
  for (uVar2 = 0;
      pTVar1 = (this->indexToPipeInput).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->indexToPipeInput).
                             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50);
      uVar2 = uVar2 + 1) {
    TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + 0x50;
  }
  putchar(10);
  puts("Pipeline output reflection:");
  lVar3 = 0;
  for (uVar2 = 0;
      pTVar1 = (this->indexToPipeOutput).
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->indexToPipeOutput).
                             super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50);
      uVar2 = uVar2 + 1) {
    TObjectReflection::dump((TObjectReflection *)((long)&(pTVar1->name)._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + 0x50;
  }
  putchar(10);
  if (1 < this->localSize[0]) {
    for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
      if (1 < *(uint *)((long)this->localSize + lVar3)) {
        printf("Local size %s: %u\n",
               (long)&_ZZN7glslang11TReflection4dumpEvE4axis_rel +
               (long)*(int *)((long)&_ZZN7glslang11TReflection4dumpEvE4axis_rel + lVar3));
      }
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void TReflection::dump()
{
    printf("Uniform reflection:\n");
    for (size_t i = 0; i < indexToUniform.size(); ++i)
        indexToUniform[i].dump();
    printf("\n");

    printf("Uniform block reflection:\n");
    for (size_t i = 0; i < indexToUniformBlock.size(); ++i)
        indexToUniformBlock[i].dump();
    printf("\n");

    printf("Buffer variable reflection:\n");
    for (size_t i = 0; i < indexToBufferVariable.size(); ++i)
      indexToBufferVariable[i].dump();
    printf("\n");

    printf("Buffer block reflection:\n");
    for (size_t i = 0; i < indexToBufferBlock.size(); ++i)
      indexToBufferBlock[i].dump();
    printf("\n");

    printf("Pipeline input reflection:\n");
    for (size_t i = 0; i < indexToPipeInput.size(); ++i)
        indexToPipeInput[i].dump();
    printf("\n");

    printf("Pipeline output reflection:\n");
    for (size_t i = 0; i < indexToPipeOutput.size(); ++i)
        indexToPipeOutput[i].dump();
    printf("\n");

    if (getLocalSize(0) > 1) {
        static const char* axis[] = { "X", "Y", "Z" };

        for (int dim=0; dim<3; ++dim)
            if (getLocalSize(dim) > 1)
                printf("Local size %s: %u\n", axis[dim], getLocalSize(dim));

        printf("\n");
    }

    // printf("Live names\n");
    // for (TNameToIndex::const_iterator it = nameToIndex.begin(); it != nameToIndex.end(); ++it)
    //    printf("%s: %d\n", it->first.c_str(), it->second);
    // printf("\n");
}